

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::VMapEntry::~VMapEntry(VMapEntry *this)

{
  VMapEntry *this_local;
  
  this->_vptr_VMapEntry = (_func_int **)&PTR__VMapEntry_01042450;
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->abAssigned);
  std::vector<float,_std::allocator<float>_>::~vector(&this->rawData);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~VMapEntry() {}